

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.cpp
# Opt level: O0

void __thiscall TasGrid::CustomTabulated::read<false>(CustomTabulated *this,istream *is)

{
  undefined8 this_00;
  bool bVar1;
  int iVar2;
  invalid_argument *piVar3;
  reference pvVar4;
  void *pvVar5;
  reference pvVar6;
  reference pdVar7;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_a8;
  reference local_a0;
  double *w;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  iterator x;
  int l;
  int i;
  string local_38 [7];
  char dummy;
  string T;
  istream *is_local;
  CustomTabulated *this_local;
  
  T.field_2._8_8_ = is;
  ::std::__cxx11::string::string(local_38);
  ::std::operator>>((istream *)T.field_2._8_8_,local_38);
  iVar2 = ::std::__cxx11::string::compare((char *)local_38);
  if (iVar2 != 0) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar3,"ERROR: wrong file format of custom tables on line 1");
    __cxa_throw(piVar3,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  ::std::istream::get((char *)T.field_2._8_8_);
  ::std::__cxx11::string::string((string *)&l);
  ::std::__cxx11::string::operator=((string *)&this->description,(string *)&l);
  ::std::__cxx11::string::~string((string *)&l);
  ::std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)T.field_2._8_8_,(string *)&this->description);
  ::std::operator>>((istream *)T.field_2._8_8_,local_38);
  iVar2 = ::std::__cxx11::string::compare((char *)local_38);
  if (iVar2 != 0) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar3,"ERROR: wrong file format of custom tables on line 2");
    __cxa_throw(piVar3,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  ::std::istream::operator>>((void *)T.field_2._8_8_,&this->num_levels);
  ::std::vector<int,_std::allocator<int>_>::resize(&this->num_nodes,(long)this->num_levels);
  ::std::vector<int,_std::allocator<int>_>::resize(&this->precision,(long)this->num_levels);
  for (x._M_current._4_4_ = 0; this_00 = T.field_2._8_8_, x._M_current._4_4_ < this->num_levels;
      x._M_current._4_4_ = x._M_current._4_4_ + 1) {
    pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->num_nodes,(long)x._M_current._4_4_);
    pvVar5 = (void *)::std::istream::operator>>((void *)this_00,pvVar4);
    pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->precision,(long)x._M_current._4_4_);
    ::std::istream::operator>>(pvVar5,pvVar4);
  }
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->nodes,(long)this->num_levels);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->weights,(long)this->num_levels);
  for (x._M_current._0_4_ = 0; (int)x._M_current < this->num_levels;
      x._M_current._0_4_ = (int)x._M_current + 1) {
    pvVar6 = ::std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->nodes,(long)(int)x._M_current);
    pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->num_nodes,(long)(int)x._M_current);
    ::std::vector<double,_std::allocator<double>_>::resize(pvVar6,(long)*pvVar4);
    pvVar6 = ::std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->weights,(long)(int)x._M_current);
    pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->num_nodes,(long)(int)x._M_current);
    ::std::vector<double,_std::allocator<double>_>::resize(pvVar6,(long)*pvVar4);
    pvVar6 = ::std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->nodes,(long)(int)x._M_current);
    __range4 = (value_type *)::std::vector<double,_std::allocator<double>_>::begin(pvVar6);
    pvVar6 = ::std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->weights,(long)(int)x._M_current);
    __end4 = ::std::vector<double,_std::allocator<double>_>::begin(pvVar6);
    w = (double *)::std::vector<double,_std::allocator<double>_>::end(pvVar6);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end4,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  *)&w);
      if (!bVar1) break;
      local_a0 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&__end4);
      pvVar5 = (void *)::std::istream::operator>>((void *)T.field_2._8_8_,local_a0);
      local_a8 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator++((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)&__range4,0);
      pdVar7 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_a8);
      ::std::istream::operator>>(pvVar5,pdVar7);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&__end4);
    }
  }
  ::std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void CustomTabulated::read(std::istream &is){
    if (iomode == mode_ascii){ // messy format chosen for better human readability, hard to template and generalize
        std::string T;
        char dummy;
        is >> T;
        if (!(T.compare("description:") == 0)){ throw std::invalid_argument("ERROR: wrong file format of custom tables on line 1"); }
        is.get(dummy);
        description = std::string();
        getline(is, description);

        is >> T;
        if (!(T.compare("levels:") == 0)){ throw std::invalid_argument("ERROR: wrong file format of custom tables on line 2"); }
        is >> num_levels;

        num_nodes.resize(num_levels);
        precision.resize(num_levels);
        for(int i=0; i<num_levels; i++)
            is >> num_nodes[i] >> precision[i];

        nodes.resize(num_levels);
        weights.resize(num_levels);
        for(int l=0; l<num_levels; l++){
            nodes[l].resize(num_nodes[l]);
            weights[l].resize(num_nodes[l]);
            auto x = nodes[l].begin();
            for(auto &w : weights[l]) is >> w >> *x++;
        }
    }else{
        int num_description = 0;
        is.read((char*) &num_description, sizeof(int));
        std::vector<char> desc((size_t) num_description+1);
        is.read(desc.data(), num_description);
        desc[num_description] = '\0';
        description = desc.data();

        is.read((char*) &num_levels, sizeof(int));
        num_nodes.resize(num_levels);
        precision.resize(num_levels);
        is.read((char*) num_nodes.data(), num_levels * sizeof(int));
        is.read((char*) precision.data(), num_levels * sizeof(int));

        nodes.resize(num_levels);
        weights.resize(num_levels);
        for(int l=0; l<num_levels; l++){
            nodes[l].resize(num_nodes[l]);
            weights[l].resize(num_nodes[l]);
            is.read((char*) weights[l].data(), num_nodes[l] * sizeof(double));
            is.read((char*) nodes[l].data(), num_nodes[l] * sizeof(double));
        }
    }
}